

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::arg_integer(Simulator *this,PCode *code)

{
  Type TVar1;
  reference pvVar2;
  string *psVar3;
  int *piVar4;
  double *pdVar5;
  simulator_error *this_00;
  allocator local_1b9;
  string local_1b8;
  int local_194;
  bool local_18d;
  int local_18c;
  Symbol local_188;
  bool local_fd;
  int local_fc;
  Symbol local_f8;
  undefined1 local_60 [8];
  StackSymbol back;
  PCode *code_local;
  Simulator *this_local;
  
  back.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)code;
  pvVar2 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(&this->stack_);
  StackSymbol::StackSymbol((StackSymbol *)local_60,pvVar2);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  TVar1 = StackSymbol::type((StackSymbol *)local_60);
  if (TVar1 == kInt) {
    psVar3 = PCode::first_abi_cxx11_
                       ((PCode *)back.value_.real_array.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    piVar4 = StackSymbol::int_value((StackSymbol *)local_60);
    local_fc = *piVar4;
    local_fd = true;
    Symbol::Symbol(&local_f8,psVar3,&local_fc,&local_fd);
    ScopeTree::define(&this->tree_,&local_f8);
    Symbol::~Symbol(&local_f8);
  }
  else {
    TVar1 = StackSymbol::type((StackSymbol *)local_60);
    if (TVar1 != kReal) {
      this_00 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_194 = eip(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b8,anon_var_dwarf_a1b7,&local_1b9);
      simulator_error::simulator_error(this_00,&local_194,&local_1b8);
      __cxa_throw(this_00,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    psVar3 = PCode::first_abi_cxx11_
                       ((PCode *)back.value_.real_array.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    pdVar5 = StackSymbol::real_value((StackSymbol *)local_60);
    local_18c = (int)*pdVar5;
    local_18d = true;
    Symbol::Symbol(&local_188,psVar3,&local_18c,&local_18d);
    ScopeTree::define(&this->tree_,&local_188);
    Symbol::~Symbol(&local_188);
  }
  inc_eip(this);
  StackSymbol::~StackSymbol((StackSymbol *)local_60);
  return;
}

Assistant:

void Simulator::arg_integer(const PCode &code) {
    StackSymbol back = stack_.back();
    stack_.pop_back();

    if (back.type() == StackSymbol::Type::kInt) {
        tree_.define(Symbol(code.first(), (int)back.int_value(), true));
    } else if (back.type() == StackSymbol::Type::kReal) {
        tree_.define(Symbol(code.first(), (int)back.real_value(), true));
    } else {
        throw simulator_error(eip(), "不支持的函数调用实参类型");
    }

    inc_eip();
}